

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall
wasm::PrintExpressionContents::visitStructCmpxchg(PrintExpressionContents *this,StructCmpxchg *curr)

{
  ostream *stream;
  undefined8 in_RAX;
  HeapType type;
  undefined8 uStack_28;
  
  stream = this->o;
  uStack_28 = in_RAX;
  Colors::outputColorCode(stream,"\x1b[35m");
  Colors::outputColorCode(stream,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(this->o,"struct.atomic.rmw.cmpxchg ",0x1a);
  Colors::outputColorCode(this->o,"\x1b[0m");
  if (curr->order == AcqRel) {
    std::__ostream_insert<char,std::char_traits<char>>(this->o,"acqrel ",7);
    if (curr->order == AcqRel) {
      std::__ostream_insert<char,std::char_traits<char>>(this->o,"acqrel ",7);
    }
  }
  type = wasm::Type::getHeapType(&curr->ref->type);
  PrintSExpression::printHeapTypeName(this->parent,type);
  uStack_28 = CONCAT17(0x20,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)((long)&uStack_28 + 7),1);
  printFieldName(this,type,curr->index);
  return;
}

Assistant:

void visitStructCmpxchg(StructCmpxchg* curr) {
    prepareColor(o);
    o << "struct.atomic.rmw.cmpxchg ";
    restoreNormalColor(o);
    printMemoryOrder(curr->order);
    printMemoryOrder(curr->order);
    auto heapType = curr->ref->type.getHeapType();
    printHeapTypeName(heapType);
    o << ' ';
    printFieldName(heapType, curr->index);
  }